

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pBlendTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Performance::BlendCase::BlendCase
          (BlendCase *this,Context *context,char *name,char *description,GLenum modeRGB,
          GLenum modeAlpha,GLenum srcRGB,GLenum dstRGB,GLenum srcAlpha,GLenum dstAlpha)

{
  deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
            (&this->super_ShaderPerformanceCase,context->m_testCtx,context->m_renderCtx,name,
             description,CASETYPE_FRAGMENT);
  (this->super_ShaderPerformanceCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlendCase_0212d000;
  this->m_modeRGB = modeRGB;
  this->m_modeAlpha = modeAlpha;
  this->m_srcRGB = srcRGB;
  this->m_dstRGB = dstRGB;
  this->m_srcAlpha = srcAlpha;
  this->m_dstAlpha = dstAlpha;
  return;
}

Assistant:

BlendCase::BlendCase (Context& context, const char* name, const char* description, GLenum modeRGB, GLenum modeAlpha, GLenum srcRGB, GLenum dstRGB, GLenum srcAlpha, GLenum dstAlpha)
	: ShaderPerformanceCase	(context.getTestContext(), context.getRenderContext(), name, description, CASETYPE_FRAGMENT)
	, m_modeRGB				(modeRGB)
	, m_modeAlpha			(modeAlpha)
	, m_srcRGB				(srcRGB)
	, m_dstRGB				(dstRGB)
	, m_srcAlpha			(srcAlpha)
	, m_dstAlpha			(dstAlpha)
{
}